

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *window_for_height;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint local_48;
  ImGuiSizeCallbackData local_38;
  
  pIVar4 = GImGui;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = size_desired->x;
  auVar7._4_4_ = size_desired->y;
  if (((GImGui->NextWindowData).Flags & 0x10) == 0) goto LAB_0014f886;
  fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
  fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
  if ((fVar1 < 0.0) || (fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar6 < 0.0)) {
    auVar8 = ZEXT416((uint)(window->SizeFull).x);
  }
  else {
    auVar9 = vminss_avx(ZEXT416((uint)fVar6),auVar7);
    auVar8 = vcmpss_avx(auVar7,ZEXT416((uint)fVar1),1);
    auVar8 = vblendvps_avx(auVar9,ZEXT416((uint)fVar1),auVar8);
  }
  if (fVar5 < 0.0) {
LAB_0014f837:
    auVar7 = ZEXT416((uint)(window->SizeFull).y);
  }
  else {
    fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Max.y;
    if (fVar1 < 0.0) goto LAB_0014f837;
    auVar7 = vmovshdup_avx(auVar7);
    auVar9 = vminss_avx(ZEXT416((uint)fVar1),auVar7);
    auVar7 = vcmpss_avx(auVar7,ZEXT416((uint)fVar5),1);
    auVar7 = vblendvps_avx(auVar9,ZEXT416((uint)fVar5),auVar7);
  }
  auVar8 = vinsertps_avx(auVar8,auVar7,0x10);
  p_Var2 = (GImGui->NextWindowData).SizeCallback;
  if (p_Var2 != (ImGuiSizeCallback)0x0) {
    local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
    local_38.Pos = window->Pos;
    local_38.CurrentSize = window->SizeFull;
    local_38.DesiredSize = (ImVec2)vmovlps_avx(auVar8);
    (*p_Var2)(&local_38);
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_38.DesiredSize.x;
    auVar8._4_4_ = local_38.DesiredSize.y;
  }
  auVar9._0_4_ = (int)auVar8._0_4_;
  auVar9._4_4_ = (int)auVar8._4_4_;
  auVar9._8_4_ = (int)auVar8._8_4_;
  auVar9._12_4_ = (int)auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar9);
LAB_0014f886:
  IVar3 = auVar7._0_8_;
  if ((window->Flags & 0x1000040U) == 0) {
    auVar9 = vmovshdup_avx(auVar7);
    auVar10 = ZEXT416((uint)(pIVar4->Style).WindowMinSize.y);
    auVar8 = vcmpss_avx(auVar10,auVar9,2);
    auVar9 = vblendvps_avx(auVar10,auVar9,auVar8);
    fVar1 = (pIVar4->Style).WindowMinSize.x;
    fVar5 = ImGuiWindow::TitleBarHeight(window);
    fVar6 = ImGuiWindow::MenuBarHeight(window);
    auVar10 = ZEXT416((uint)((pIVar4->Style).WindowRounding + -1.0));
    auVar8 = vcmpss_avx(auVar10,ZEXT816(0) << 0x40,2);
    auVar8 = vandnps_avx(auVar8,auVar10);
    auVar8 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar6 + fVar5 + auVar8._0_4_)),0x10);
    local_48 = auVar9._0_4_;
    auVar9 = vinsertps_avx(auVar7,ZEXT416(local_48),0x10);
    auVar7 = vcmpps_avx(auVar8,auVar9,2);
    auVar7 = vblendvps_avx(auVar8,auVar9,auVar7);
    IVar3 = auVar7._0_8_;
  }
  return IVar3;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}